

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void mi_option_set_enabled(mi_option_t option,_Bool enable)

{
  undefined3 in_EAX;
  undefined1 in_SIL;
  undefined4 in_EDI;
  
  mi_option_set(option,CONCAT44(in_EDI,CONCAT13(in_SIL,in_EAX)) & 0xffffffff01ffffff);
  return;
}

Assistant:

void mi_option_set_enabled(mi_option_t option, bool enable) {
  mi_option_set(option, (enable ? 1 : 0));
}